

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportInstallFileGenerator::InstallNameDir
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,
          cmGeneratorTarget *target,string *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  allocator local_41;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = target->Target->Makefile;
  std::__cxx11::string::string((string *)&local_40,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_41);
  bVar1 = cmMakefile::IsOn(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_(&local_40,target);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::InstallNameDir(
  cmGeneratorTarget* target, const std::string& /*config*/)
{
  std::string install_name_dir;

  cmMakefile* mf = target->Target->GetMakefile();
  if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    install_name_dir = target->GetInstallNameDirForInstallTree();
  }

  return install_name_dir;
}